

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O2

void DNA::print(Base *dna,size_t dna_size)

{
  size_t sVar1;
  
  for (sVar1 = 0; dna_size != sVar1; sVar1 = sVar1 + 1) {
    if ((ulong)dna[sVar1] < 4) {
      putc(*(int *)(&DAT_00102020 + (ulong)dna[sVar1] * 4),_stdout);
    }
  }
  return;
}

Assistant:

void DNA::print(const DNA::Base* dna, size_t dna_size)
{
    while (dna_size--) {
        switch (*dna++) {
             case DNA::A:
                 std::putc('A', stdout);
                 break;
             case DNA::C:
                 std::putc('C', stdout);
                 break;
             case DNA::G:
                 std::putc('G', stdout);
                 break;
             case DNA::T:
                 std::putc('T', stdout);
                 break;
        }
    }
}